

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.hpp
# Opt level: O1

void __thiscall Omega_h::Write<long>::~Write(Write<long> *this)

{
  int *piVar1;
  Alloc *this_00;
  
  this_00 = (this->shared_alloc_).alloc;
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      return;
    }
  }
  return;
}

Assistant:

OMEGA_H_INLINE LO size() const OMEGA_H_NOEXCEPT { return write_.size(); }